

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O1

EGLSurface glfwGetEGLSurface(GLFWwindow *handle)

{
  int error;
  
  if (_glfw.initialized == 0) {
    error = 0x10001;
  }
  else {
    if (*(int *)(handle + 0x1f0) != 0) {
      return *(EGLSurface *)(handle + 0x288);
    }
    error = 0x1000a;
  }
  _glfwInputError(error,(char *)0x0);
  return (EGLSurface)0x0;
}

Assistant:

GLFWAPI EGLSurface glfwGetEGLSurface(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    _GLFW_REQUIRE_INIT_OR_RETURN(EGL_NO_SURFACE);

    if (window->context.client == GLFW_NO_API)
    {
        _glfwInputError(GLFW_NO_WINDOW_CONTEXT, NULL);
        return EGL_NO_SURFACE;
    }

    return window->context.egl.surface;
}